

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O0

errc trial::protocol::bintoken::to_errc(value value)

{
  errc local_c;
  value value_local;
  
  switch(value) {
  case error_unknown_token:
    local_c = unknown_token;
    break;
  case error_unexpected_token:
    local_c = unexpected_token;
    break;
  default:
    local_c = no_error;
    break;
  case error_negative_length:
    local_c = negative_length;
    break;
  case error_overflow:
    local_c = overflow;
    break;
  case error_invalid_value:
    local_c = invalid_value;
    break;
  case error_expected_end_record:
    local_c = expected_end_record;
    break;
  case error_expected_end_array:
    local_c = expected_end_array;
    break;
  case error_expected_end_assoc_array:
    local_c = expected_end_assoc_array;
  }
  return local_c;
}

Assistant:

inline enum errc to_errc(token::code::value value)
{
    switch (value)
    {
    case token::code::error_unknown_token:
        return unknown_token;

    case token::code::error_unexpected_token:
        return unexpected_token;

    case token::code::error_negative_length:
        return negative_length;

    case token::code::error_overflow:
        return overflow;

    case token::code::error_invalid_value:
        return invalid_value;

    case token::code::error_expected_end_record:
        return expected_end_record;

    case token::code::error_expected_end_array:
        return expected_end_array;

    case token::code::error_expected_end_assoc_array:
        return expected_end_assoc_array;

    default:
        return no_error;
    }
}